

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardFile.cpp
# Opt level: O0

size_t __thiscall Diligent::StandardFile::GetSize(StandardFile *this)

{
  Char *Message;
  long __off;
  size_t sVar1;
  long FileSize;
  long OrigPos;
  undefined1 local_30 [8];
  string msg;
  StandardFile *this_local;
  
  msg.field_2._8_8_ = this;
  if (this->m_pFile == (FILE *)0x0) {
    FormatString<char[19]>((string *)local_30,(char (*) [19])"File is not opened");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetSize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/StandardFile.cpp"
               ,0x59);
    std::__cxx11::string::~string((string *)local_30);
  }
  __off = ftell((FILE *)this->m_pFile);
  fseek((FILE *)this->m_pFile,0,2);
  sVar1 = ftell((FILE *)this->m_pFile);
  fseek((FILE *)this->m_pFile,__off,0);
  return sVar1;
}

Assistant:

size_t StandardFile::GetSize()
{
    VERIFY(m_pFile, "File is not opened");
    auto OrigPos = ftell(m_pFile);
    fseek(m_pFile, 0, SEEK_END);
    auto FileSize = ftell(m_pFile);

    fseek(m_pFile, OrigPos, SEEK_SET);
    return FileSize;
}